

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::SimpleTypeHandler<2UL>::FindNextProperty
          (SimpleTypeHandler<2UL> *this,ScriptContext *scriptContext,PropertyIndex *index,
          JavascriptString **propertyStringName,PropertyId *propertyId,
          PropertyAttributes *attributes,Type *type,DynamicType *typeToEnumerate,
          EnumeratorFlags flags,DynamicObject *instance,PropertyValueInfo *info)

{
  int iVar1;
  PropertyId propertyId_00;
  long lVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  PropertyString *this_00;
  PolymorphicInlineCache *polymorphicInlineCache;
  PropertyRecordUsageCache *propertyRecordUsageCache;
  PropertyIndex PVar7;
  uint uVar8;
  uint uVar9;
  byte bVar10;
  
  if (propertyStringName == (JavascriptString **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                ,0x138,"(propertyStringName)","propertyStringName");
    if (!bVar4) goto LAB_00e51198;
    *puVar6 = 0;
  }
  if (propertyId == (PropertyId *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                ,0x139,"(propertyId)","propertyId");
    if (!bVar4) goto LAB_00e51198;
    *puVar6 = 0;
  }
  if (type == (Type *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                ,0x13a,"(type)","type");
    if (!bVar4) {
LAB_00e51198:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  iVar1 = this->propertyCount;
  uVar8 = (uint)*index;
  uVar9 = (uint)*index;
  do {
    if (iVar1 <= (int)uVar9) {
      BVar5 = 0;
LAB_00e510df:
      if (info != (PropertyValueInfo *)0x0) {
        PVar7 = 0xffff;
        bVar10 = 0;
LAB_00e510eb:
        info->m_instance = &instance->super_RecyclableObject;
        info->m_propertyIndex = PVar7;
        info->m_attributes = bVar10;
        info->flags = InlineCacheNoFlags;
      }
      return BVar5;
    }
    uVar8 = uVar8 & 0xffff;
    bVar10 = *(byte *)((long)&this->descriptors[0].field_1 + (ulong)(uVar8 << 4));
    if ((((bVar10 & 8) == 0) && (((flags & EnumNonEnumerable) != None || ((bVar10 & 1) != 0)))) &&
       ((lVar2 = *(long *)((long)&this->descriptors[0].Id.ptr + (ulong)(uVar8 << 4)),
        (flags & EnumSymbols) != None || (*(char *)(lVar2 + 0x12) == '\0')))) {
      if (attributes != (PropertyAttributes *)0x0) {
        *attributes = bVar10;
      }
      propertyId_00 = *(PropertyId *)(lVar2 + 8);
      *propertyId = propertyId_00;
      this_00 = ScriptContext::GetPropertyString(scriptContext,propertyId_00);
      *propertyStringName = &this_00->super_JavascriptString;
      polymorphicInlineCache = PropertyString::GetLdElemInlineCache(this_00);
      propertyRecordUsageCache = PropertyString::GetPropertyRecordUsageCache(this_00);
      PropertyValueInfo::SetCacheInfo
                (info,(RecyclableObject *)this_00,propertyRecordUsageCache,polymorphicInlineCache,
                 false);
      if (((DynamicType *)type != typeToEnumerate) || ((bVar10 & 4) == 0)) {
        BVar5 = 1;
        goto LAB_00e510df;
      }
      if (info == (PropertyValueInfo *)0x0) {
        return 1;
      }
      PVar7 = *index;
      BVar5 = 1;
      goto LAB_00e510eb;
    }
    uVar8 = uVar8 + 1;
    *index = (PropertyIndex)uVar8;
    uVar9 = uVar8 & 0xffff;
  } while( true );
}

Assistant:

BOOL SimpleTypeHandler<size>::FindNextProperty(ScriptContext* scriptContext, PropertyIndex& index, JavascriptString** propertyStringName,
        PropertyId* propertyId, PropertyAttributes* attributes, Type* type, DynamicType *typeToEnumerate, EnumeratorFlags flags, DynamicObject* instance, PropertyValueInfo* info)
    {
        Assert(propertyStringName);
        Assert(propertyId);
        Assert(type);

        for( ; index < propertyCount; ++index )
        {
            PropertyAttributes attribs = descriptors[index].Attributes;
            if( !(attribs & PropertyDeleted) && (!!(flags & EnumeratorFlags::EnumNonEnumerable) || (attribs & PropertyEnumerable)))
            {
                const PropertyRecord* propertyRecord = descriptors[index].Id;

                // Skip this property if it is a symbol and we are not including symbol properties
                if (!(flags & EnumeratorFlags::EnumSymbols) && propertyRecord->IsSymbol())
                {
                    continue;
                }

                if (attributes != nullptr)
                {
                    *attributes = attribs;
                }

                *propertyId = propertyRecord->GetPropertyId();
                PropertyString * propStr = scriptContext->GetPropertyString(*propertyId);
                *propertyStringName = propStr;

                PropertyValueInfo::SetCacheInfo(info, propStr, propStr->GetLdElemInlineCache(), false);
                if ((attribs & PropertyWritable) == PropertyWritable && type == typeToEnumerate)
                {
                    PropertyValueInfo::Set(info, instance, index, attribs);
                }
                else
                {
                    PropertyValueInfo::SetNoCache(info, instance);
                }
                return TRUE;
            }
        }
        PropertyValueInfo::SetNoCache(info, instance);

        return FALSE;
    }